

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

ecs_entity_t
ecs_lookup_path_w_sep(ecs_world_t *world,ecs_entity_t parent,char *path,char *sep,char *prefix)

{
  bool bVar1;
  char *pcStack_98;
  _Bool core_searched;
  ecs_entity_t cur;
  char *ptr;
  char buff [64];
  ecs_entity_t e;
  char *prefix_local;
  char *sep_local;
  char *path_local;
  ecs_entity_t parent_local;
  ecs_world_t *world_local;
  
  if (path == (char *)0x0) {
    world_local = (ecs_world_t *)0x0;
  }
  else {
    sep_local = path;
    path_local = (char *)parent;
    parent_local = (ecs_entity_t)world;
    world_local = (ecs_world_t *)find_as_alias(world,path);
    if (world_local == (ecs_world_t *)0x0) {
      bVar1 = false;
      prefix_local = sep;
      if (sep == (char *)0x0) {
        prefix_local = ".";
      }
      path_local = (char *)get_parent_from_path
                                     ((ecs_world_t *)parent_local,(ecs_entity_t)path_local,
                                      &sep_local,prefix);
      do {
        pcStack_98 = path_local;
        cur = (ecs_entity_t)sep_local;
        do {
          cur = (ecs_entity_t)path_elem((char *)cur,(char *)&ptr,prefix_local);
          if ((char *)cur == (char *)0x0) break;
          pcStack_98 = (char *)ecs_lookup_child((ecs_world_t *)parent_local,(ecs_entity_t)pcStack_98
                                                ,(char *)&ptr);
        } while (pcStack_98 != (char *)0x0);
        if ((pcStack_98 != (char *)0x0) || (bVar1)) {
          return (ecs_entity_t)pcStack_98;
        }
        if (path_local == (char *)0x0) {
          path_local = (char *)0x118;
          bVar1 = true;
        }
        else {
          path_local = (char *)ecs_get_parent_w_entity
                                         ((ecs_world_t *)parent_local,(ecs_entity_t)path_local,0);
        }
      } while( true );
    }
  }
  return (ecs_entity_t)world_local;
}

Assistant:

ecs_entity_t ecs_lookup_path_w_sep(
    ecs_world_t *world,
    ecs_entity_t parent,
    const char *path,
    const char *sep,
    const char *prefix)
{
    if (!path) {
        return 0;
    }

    ecs_entity_t e = find_as_alias(world, path);
    if (e) {
        return e;
    }      
    
    char buff[ECS_MAX_NAME_LENGTH];
    const char *ptr;
    ecs_entity_t cur;
    bool core_searched = false;

    if (!sep) {
        sep = ".";
    }

    parent = get_parent_from_path(world, parent, &path, prefix);

retry:
    cur = parent;
    ptr = path;

    while ((ptr = path_elem(ptr, buff, sep))) {
        cur = ecs_lookup_child(world, cur, buff);
        if (!cur) {
            goto tail;
        }
    }

tail:
    if (!cur) {
        if (!core_searched) {
            if (parent) {
                parent = ecs_get_parent_w_entity(world, parent, 0);
            } else {
                parent = EcsFlecsCore;
                core_searched = true;
            }
            goto retry;
        }
    }

    return cur;
}